

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O1

int CfdCreateConfidentialSighash
              (void *handle,char *tx_hex_string,char *txid,uint32_t vout,int hash_type,char *pubkey,
              char *redeem_script,int64_t value_satoshi,char *value_commitment,int sighash_type,
              bool sighash_anyone_can_pay,char **sighash)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  bool bVar4;
  HashType hash_type_00;
  char *pcVar5;
  CfdException *pCVar6;
  Amount AVar7;
  allocator local_12b;
  allocator local_12a;
  ElementsTransactionApi api;
  ConfidentialValue value;
  string sighash_bytes;
  ByteData local_b8;
  undefined1 local_a0 [16];
  char local_90 [16];
  Txid local_80;
  string local_60;
  SigHashType sighashtype;
  
  cfd::Initialize();
  bVar4 = cfd::capi::IsEmptyString(tx_hex_string);
  if (bVar4) {
    value._vptr_ConfidentialValue = (_func_int **)0x5f3c92;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(value.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x72d);
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::log<>((CfdSourceLocation *)&value,kCfdLogLevelWarning,"tx is null or empty.")
    ;
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    value._vptr_ConfidentialValue =
         (_func_int **)
         &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&value,"Failed to parameter. tx is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar4 = cfd::capi::IsEmptyString(txid);
  if (bVar4) {
    value._vptr_ConfidentialValue = (_func_int **)0x5f3c92;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(value.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x733);
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::log<>
              ((CfdSourceLocation *)&value,kCfdLogLevelWarning,"txid is null or empty.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    value._vptr_ConfidentialValue =
         (_func_int **)
         &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&value,"Failed to parameter. txid is null or empty.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (sighash == (char **)0x0) {
    value._vptr_ConfidentialValue = (_func_int **)0x5f3c92;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(value.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x739);
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::log<>((CfdSourceLocation *)&value,kCfdLogLevelWarning,"sighash is null.");
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    value._vptr_ConfidentialValue =
         (_func_int **)
         &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&value,"Failed to parameter. sighash is null.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  hash_type_00 = cfd::capi::ConvertHashToAddressType(0);
  switch(hash_type_00) {
  case kP2sh:
    bVar2 = 1;
    goto LAB_00401bb1;
  case kP2wpkh:
    bVar2 = 0;
    bVar1 = 0;
    hash_type_00 = kP2pkh;
    break;
  case kP2wsh:
  case 5:
    hash_type_00 = kP2wsh;
    bVar1 = 1;
    bVar2 = 0;
    break;
  case 4:
  case kTaproot:
    hash_type_00 = kP2wpkh;
    bVar2 = 0;
LAB_00401bb1:
    bVar1 = 0;
    break;
  default:
    value._vptr_ConfidentialValue = (_func_int **)0x5f3c92;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)CONCAT44(value.data_.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x753);
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
    cfd::core::logger::log<>((CfdSourceLocation *)&value,kCfdLogLevelWarning,"hashtype is illegal.")
    ;
    pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
    value._vptr_ConfidentialValue =
         (_func_int **)
         &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&value,"Failed to parameter. hashtype is illegal.","");
    cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&value);
    __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  cfd::core::ByteData::ByteData(&local_b8);
  if ((bool)(bVar2 | bVar1)) {
    bVar4 = cfd::capi::IsEmptyString(redeem_script);
    if (bVar4) {
      value._vptr_ConfidentialValue = (_func_int **)0x5f3c92;
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(value.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x75d);
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&value,kCfdLogLevelWarning,"redeem script is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      value._vptr_ConfidentialValue =
           (_func_int **)
           &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&value,"Failed to parameter. redeem script is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&value);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&sighash_bytes,redeem_script,(allocator *)local_a0);
    cfd::core::Script::Script((Script *)&value,&sighash_bytes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)sighash_bytes._M_dataplus._M_p != &sighash_bytes.field_2) {
      operator_delete(sighash_bytes._M_dataplus._M_p);
    }
    cfd::core::Script::GetData((ByteData *)&sighash_bytes,(Script *)&value);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_b8,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash_bytes);
    if (sighash_bytes._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(sighash_bytes._M_dataplus._M_p);
    }
    cfd::core::Script::~Script((Script *)&value);
  }
  else {
    bVar4 = cfd::capi::IsEmptyString(pubkey);
    if (bVar4) {
      value._vptr_ConfidentialValue = (_func_int **)0x5f3c92;
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT44(value.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start._4_4_,0x766);
      value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = "CfdCreateConfidentialSighash";
      cfd::core::logger::log<>
                ((CfdSourceLocation *)&value,kCfdLogLevelWarning,"pubkey is null or empty.");
      pCVar6 = (CfdException *)__cxa_allocate_exception(0x30);
      value._vptr_ConfidentialValue =
           (_func_int **)
           &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&value,"Failed to parameter. pubkey is null or empty.","");
      cfd::core::CfdException::CfdException(pCVar6,kCfdIllegalArgumentError,(string *)&value);
      __cxa_throw(pCVar6,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
    }
    std::__cxx11::string::string((string *)&value,pubkey,(allocator *)local_a0);
    cfd::core::Pubkey::Pubkey((Pubkey *)&sighash_bytes,(string *)&value);
    if (value._vptr_ConfidentialValue !=
        (_func_int **)
        &value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish) {
      operator_delete(value._vptr_ConfidentialValue);
    }
    cfd::core::Pubkey::GetData((ByteData *)&value,(Pubkey *)&sighash_bytes);
    puVar3 = local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)value._vptr_ConfidentialValue;
    local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish =
         value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_start;
    local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
         .super__Vector_impl_data._M_finish;
    value._vptr_ConfidentialValue = (_func_int **)0x0;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if ((_func_int **)puVar3 != (_func_int **)0x0) {
      operator_delete(puVar3);
    }
    if (value._vptr_ConfidentialValue != (_func_int **)0x0) {
      operator_delete(value._vptr_ConfidentialValue);
    }
    if (sighash_bytes._M_dataplus._M_p != (pointer)0x0) {
      operator_delete(sighash_bytes._M_dataplus._M_p);
    }
  }
  cfd::core::ConfidentialValue::ConfidentialValue(&value);
  bVar4 = cfd::capi::IsEmptyString(value_commitment);
  if (bVar4) {
    AVar7 = cfd::core::Amount::CreateBySatoshiAmount(value_satoshi);
    local_a0._0_8_ = AVar7.amount_;
    local_a0[8] = AVar7.ignore_check_;
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&sighash_bytes,(Amount *)local_a0);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&sighash_bytes);
    sighash_bytes._M_dataplus._M_p = "\x062\x1e";
    if (sighash_bytes._M_string_length == 0) goto LAB_00401dfd;
  }
  else {
    std::__cxx11::string::string((string *)local_a0,value_commitment,(allocator *)&local_80);
    cfd::core::ConfidentialValue::ConfidentialValue
              ((ConfidentialValue *)&sighash_bytes,(string *)local_a0);
    cfd::core::ConfidentialValue::operator=(&value,(ConfidentialValue *)&sighash_bytes);
    sighash_bytes._M_dataplus._M_p = "\x062\x1e";
    if (sighash_bytes._M_string_length != 0) {
      operator_delete((void *)sighash_bytes._M_string_length);
    }
    sighash_bytes._M_string_length = local_a0._0_8_;
    if ((char *)local_a0._0_8_ == local_90) goto LAB_00401dfd;
  }
  operator_delete((void *)sighash_bytes._M_string_length);
LAB_00401dfd:
  cfd::core::SigHashType::Create(&sighashtype,(uint8_t)sighash_type,sighash_anyone_can_pay,false);
  std::__cxx11::string::string((string *)local_a0,tx_hex_string,&local_12a);
  std::__cxx11::string::string((string *)&local_60,txid,&local_12b);
  cfd::core::Txid::Txid(&local_80,&local_60);
  cfd::api::ElementsTransactionApi::CreateSignatureHash
            (&sighash_bytes,&api,(string *)local_a0,&local_80,vout,&local_b8,&value,hash_type_00,
             &sighashtype);
  local_80._vptr_Txid = (_func_int **)&PTR__Txid_00735400;
  if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  if ((char *)local_a0._0_8_ != local_90) {
    operator_delete((void *)local_a0._0_8_);
  }
  pcVar5 = cfd::capi::CreateString(&sighash_bytes);
  *sighash = pcVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)sighash_bytes._M_dataplus._M_p != &sighash_bytes.field_2) {
    operator_delete(sighash_bytes._M_dataplus._M_p);
  }
  value._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_007357f0;
  if (value.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(value.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((_func_int **)
      local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (_func_int **)0x0) {
    operator_delete(local_b8.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int CfdCreateConfidentialSighash(
    void* handle, const char* tx_hex_string, const char* txid, uint32_t vout,
    int hash_type, const char* pubkey, const char* redeem_script,
    int64_t value_satoshi, const char* value_commitment, int sighash_type,
    bool sighash_anyone_can_pay, char** sighash) {
  try {
    cfd::Initialize();
    if (IsEmptyString(tx_hex_string)) {
      warn(CFD_LOG_SOURCE, "tx is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tx is null or empty.");
    }
    if (IsEmptyString(txid)) {
      warn(CFD_LOG_SOURCE, "txid is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. txid is null or empty.");
    }
    if (sighash == nullptr) {
      warn(CFD_LOG_SOURCE, "sighash is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. sighash is null.");
    }

    AddressType addr_type = ConvertHashToAddressType(hash_type);
    HashType core_hash_type;
    switch (addr_type) {
      case AddressType::kP2shAddress:
        core_hash_type = HashType::kP2sh;
        break;
      case AddressType::kP2wshAddress:
        // fall-through
      case AddressType::kP2shP2wshAddress:
        core_hash_type = HashType::kP2wsh;
        break;
      case AddressType::kP2pkhAddress:
        core_hash_type = HashType::kP2pkh;
        break;
      case AddressType::kP2wpkhAddress:
        // fall-through
      case AddressType::kP2shP2wpkhAddress:
        core_hash_type = HashType::kP2wpkh;
        break;
      default:
        warn(CFD_LOG_SOURCE, "hashtype is illegal.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. hashtype is illegal.");
    }

    ByteData key_data;
    if ((core_hash_type == HashType::kP2sh) ||
        (core_hash_type == HashType::kP2wsh)) {
      if (IsEmptyString(redeem_script)) {
        warn(CFD_LOG_SOURCE, "redeem script is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. redeem script is null or empty.");
      }
      Script redeem_script_obj = Script(redeem_script);
      key_data = redeem_script_obj.GetData();
    } else {
      if (IsEmptyString(pubkey)) {
        warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
        throw CfdException(
            CfdError::kCfdIllegalArgumentError,
            "Failed to parameter. pubkey is null or empty.");
      }
      Pubkey pubkey_obj = Pubkey(pubkey);
      key_data = pubkey_obj.GetData();
    }

    ConfidentialValue value;
    if (IsEmptyString(value_commitment)) {
      value = ConfidentialValue(Amount::CreateBySatoshiAmount(value_satoshi));
    } else {
      value = ConfidentialValue(value_commitment);
    }

    ElementsTransactionApi api;
    SigHashType sighashtype = SigHashType::Create(
        static_cast<uint8_t>(sighash_type), sighash_anyone_can_pay);
    std::string sighash_bytes = api.CreateSignatureHash(
        std::string(tx_hex_string), Txid(std::string(txid)), vout, key_data,
        value, core_hash_type, sighashtype);
    *sighash = CreateString(sighash_bytes);
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}